

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O0

void __thiscall
JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::JustInTimeActor<unsigned_int>
          (JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1> *this,uint *args)

{
  Cycles local_20;
  uint *local_18;
  uint *args_local;
  JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1> *this_local;
  
  local_18 = args;
  args_local = (uint *)this;
  ClockingHint::Observer::Observer(&this->super_Observer);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_component_prefers_clocking_00ca7288
  ;
  Cycles::Cycles(&local_20,(ulong)*local_18);
  Amstrad::FDC::FDC(&this->object_,local_20);
  Cycles::Cycles(&this->time_since_update_);
  Cycles::Cycles(&this->time_until_event_);
  Cycles::Cycles(&this->time_overrun_);
  this->is_flushed_ = true;
  this->did_flush_ = false;
  this->clocking_preference_ = JustInTime;
  (this->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
  ClockingHint::Source::set_clocking_hint_observer((Source *)&this->object_,&this->super_Observer);
  return;
}

Assistant:

JustInTimeActor(Args&&... args) : object_(std::forward<Args>(args)...) {
			if constexpr (std::is_base_of<ClockingHint::Source, T>::value) {
				object_.set_clocking_hint_observer(this);
			}
		}